

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O3

void __thiscall
Assimp::MD3Importer::ConvertPath(MD3Importer *this,char *texture_name,char *header_name,string *out)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  
  pcVar3 = strrchr(header_name,0x5c);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = strrchr(header_name,0x2f);
  }
  pcVar4 = strrchr(texture_name,0x5c);
  if ((pcVar4 == (char *)0x0) && (pcVar4 = strrchr(texture_name,0x2f), pcVar4 == (char *)0x0)) {
LAB_0043f72c:
    pcVar3 = (char *)out->_M_string_length;
    strlen(texture_name);
  }
  else {
    if (texture_name == (char *)0x0) {
      __assert_fail("__null != s1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                    ,0xba,"int Assimp::ASSIMP_strincmp(const char *, const char *, unsigned int)");
    }
    iVar1 = strncasecmp(texture_name,"models",6);
    if ((iVar1 == 0) && ((texture_name[6] == '\\' || (texture_name[6] == '/')))) {
      uVar2 = 6;
      if (*header_name != '\0') {
LAB_0043f71b:
        iVar1 = strncasecmp(texture_name,header_name,(ulong)uVar2);
        if (iVar1 != 0) goto LAB_0043f72c;
      }
    }
    else {
      if (header_name == (char *)0x0) {
        __assert_fail("__null != s2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                      ,0xbb,"int Assimp::ASSIMP_strincmp(const char *, const char *, unsigned int)")
        ;
      }
      uVar5 = (long)pcVar4 - (long)texture_name;
      if ((ulong)((long)pcVar3 - (long)header_name) <= (ulong)((long)pcVar4 - (long)texture_name)) {
        uVar5 = (long)pcVar3 - (long)header_name;
      }
      uVar2 = (uint)uVar5;
      if (uVar2 != 0) goto LAB_0043f71b;
    }
    texture_name = pcVar4 + 1;
    pcVar3 = (char *)out->_M_string_length;
    strlen(texture_name);
  }
  std::__cxx11::string::_M_replace((ulong)out,0,pcVar3,(ulong)texture_name);
  return;
}

Assistant:

void MD3Importer::ConvertPath(const char* texture_name, const char* header_name, std::string& out) const
{
    // If the MD3's internal path itself and the given path are using
    // the same directory, remove it completely to get right output paths.
    const char* end1 = ::strrchr(header_name,'\\');
    if (!end1)end1   = ::strrchr(header_name,'/');

    const char* end2 = ::strrchr(texture_name,'\\');
    if (!end2)end2   = ::strrchr(texture_name,'/');

    // HACK: If the paths starts with "models", ignore the
    // next two hierarchy levels, it specifies just the model name.
    // Ignored by Q3, it might be not equal to the real model location.
    if (end2)   {

        size_t len2;
        const size_t len1 = (size_t)(end1 - header_name);
        if (!ASSIMP_strincmp(texture_name,"models",6) && (texture_name[6] == '/' || texture_name[6] == '\\')) {
            len2 = 6; // ignore the seventh - could be slash or backslash

            if (!header_name[0]) {
                // Use the file name only
                out = end2+1;
                return;
            }
        }
        else len2 = std::min (len1, (size_t)(end2 - texture_name ));
        if (!ASSIMP_strincmp(texture_name,header_name,static_cast<unsigned int>(len2))) {
            // Use the file name only
            out = end2+1;
            return;
        }
    }
    // Use the full path
    out = texture_name;
}